

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O2

PrimInfo *
embree::sse2::createPrimRefArrayMBlur
          (PrimInfo *__return_storage_ptr__,Scene *scene,GTypeMask types,size_t numPrimRefs,
          mvector<PrimRef> *prims,BuildProgressMonitor *progressMonitor,size_t itime)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  task *ptVar5;
  runtime_error *prVar6;
  ulong uVar7;
  task_group_context *ptVar8;
  ulong uVar9;
  size_t i_2;
  ulong uVar10;
  size_t i_1;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  size_t N;
  ulong uVar14;
  size_t i;
  size_t sVar15;
  PrimInfoT<embree::BBox<embree::Vec3fa>_> *this;
  size_t *psVar16;
  unsigned_long end;
  PrimInfo *this_00;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  float fVar27;
  float fVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined1 local_2e3a [2];
  size_t taskCount;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_2e30;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_2e28;
  PrimInfo *local_2e20;
  mvector<PrimRef> *local_2e18;
  Iterator2 *local_2e10;
  atomic<tbb::detail::r1::tbb_exception_ptr_*> local_2e08;
  void *local_2e00;
  intrusive_list_node local_2df8;
  intrusive_list_node local_2de8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2dd8;
  undefined8 local_2dc8;
  undefined8 uStack_2dc0;
  undefined8 local_2db8;
  undefined8 uStack_2db0;
  float local_2da8;
  float fStack_2da4;
  float fStack_2da0;
  float fStack_2d9c;
  undefined4 local_2d98;
  undefined4 uStack_2d94;
  undefined4 uStack_2d90;
  undefined4 uStack_2d8c;
  task_group_context context;
  undefined1 local_2d08 [8];
  undefined8 uStack_2d00;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_2cf8;
  context_list *pcStack_2cf0;
  intrusive_list_node *local_2ce8;
  intrusive_list_node *piStack_2ce0;
  undefined8 local_2cd8;
  undefined8 uStack_2cd0;
  undefined8 local_2cc8;
  undefined8 uStack_2cc0;
  Iterator2 iter;
  undefined8 local_2c98;
  undefined8 uStack_2c90;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_2c88;
  undefined8 uStack_2c80;
  undefined8 local_2c78;
  undefined8 uStack_2c70;
  undefined8 local_2c68;
  undefined8 uStack_2c60;
  string_resource_index local_2c58;
  size_t sStack_2c50;
  ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  
  pstate.super_ParallelForForState.taskCount = 0;
  iter.mblur = true;
  local_2e18 = prims;
  local_2e08._M_b._M_p = (__base_type)(__base_type)progressMonitor;
  local_2e00 = (void *)numPrimRefs;
  iter.scene = scene;
  iter.typemask = types;
  (**progressMonitor->_vptr_BuildProgressMonitor)(progressMonitor,0);
  sVar11 = (scene->geometries).size_active;
  uVar14 = 0;
  context.my_cpu_ctl_env = (uint64_t)&iter;
  for (sVar15 = 0; sVar11 != sVar15; sVar15 = sVar15 + 1) {
    sVar3 = ParallelForForState::init<embree::Scene::Iterator2>::anon_class_8_1_4d25ca37::operator()
                      ((anon_class_8_1_4d25ca37 *)&context,sVar15);
    uVar14 = uVar14 + sVar3;
  }
  local_2e20 = __return_storage_ptr__;
  pstate.super_ParallelForForState.N = uVar14;
  iVar2 = tbb::detail::d1::max_concurrency();
  uVar7 = uVar14 + 0x3ff >> 10;
  if ((ulong)(long)iVar2 < uVar7) {
    uVar7 = (long)iVar2;
  }
  uVar4 = 0x40;
  if (uVar7 < 0x40) {
    uVar4 = uVar7;
  }
  sVar11 = 0;
  pstate.super_ParallelForForState.taskCount = uVar4 + (uVar4 == 0);
  pstate.super_ParallelForForState.i0[0] = 0;
  pstate.super_ParallelForForState.j0[0] = 0;
  uVar4 = uVar14 / pstate.super_ParallelForForState.taskCount;
  uVar7 = 1;
  uVar10 = 0;
  while (sVar15 = pstate.super_ParallelForForState.taskCount,
        uVar7 < pstate.super_ParallelForForState.taskCount) {
    sVar15 = ParallelForForState::init<embree::Scene::Iterator2>::anon_class_8_1_4d25ca37::
             operator()((anon_class_8_1_4d25ca37 *)&context,sVar11);
    uVar12 = (uVar7 + 1) * uVar14;
    uVar13 = 0;
    uVar9 = uVar10;
    for (; ((uVar10 = (uVar9 + sVar15) - uVar13, uVar13 < sVar15 && (uVar4 <= uVar10)) &&
           (uVar7 < pstate.super_ParallelForForState.taskCount)); uVar7 = uVar7 + 1) {
      pstate.super_ParallelForForState.i0[uVar7] = sVar11;
      uVar13 = uVar13 + (uVar4 - uVar9);
      pstate.super_ParallelForForState.j0[uVar7] = uVar13;
      uVar10 = uVar12 / pstate.super_ParallelForForState.taskCount;
      uVar12 = uVar12 + uVar14;
      uVar9 = uVar4;
      uVar4 = uVar10;
    }
    sVar11 = sVar11 + 1;
  }
  ptVar8 = (task_group_context *)local_2d08;
  local_2d08 = (undefined1  [8])0x7f8000007f800000;
  uStack_2d00._0_4_ = (__atomic_base<unsigned_int>)0x7f800000;
  uStack_2d00._4_1_ = gold_2021U1;
  uStack_2d00._5_1_ = (context_traits)0x0;
  uStack_2d00._6_1_ = (__atomic_base<unsigned_char>)0x80;
  uStack_2d00._7_1_ = 0x7f;
  local_2cf8.my_parent = (task_group_context *)0xff800000ff800000;
  pcStack_2cf0 = (context_list *)0xff800000ff800000;
  local_2ce8 = (intrusive_list_node *)0x7f8000007f800000;
  piStack_2ce0 = (intrusive_list_node *)0x7f8000007f800000;
  local_2cd8 = (__base_type)(__pointer_type)0xff800000ff800000;
  uStack_2cd0 = (void *)0xff800000ff800000;
  local_2cc8 = ALGORITHM;
  uStack_2cc0._0_1_ = '\0';
  uStack_2cc0._1_1_ = '\0';
  uStack_2cc0._2_1_ = '\0';
  uStack_2cc0._3_1_ = '\0';
  uStack_2cc0._4_1_ = '\0';
  uStack_2cc0._5_1_ = '\0';
  uStack_2cc0._6_1_ = '\0';
  uStack_2cc0._7_1_ = '\0';
  local_2de8.my_prev_node = &local_2df8;
  local_2df8.my_prev_node = (intrusive_list_node *)local_2e18;
  local_2df8.my_next_node = (intrusive_list_node *)&itime;
  uStack_2dc0 = (context_list *)&local_2e10;
  local_2e10 = &iter;
  uStack_2db0 = &local_2de8;
  local_2dd8._8_8_ = &taskCount;
  local_2dd8._0_8_ = &pstate;
  local_2db8 = (intrusive_list_node *)local_2e3a;
  taskCount = pstate.super_ParallelForForState.taskCount;
  local_2de8.my_next_node = (intrusive_list_node *)local_2e10;
  local_2dc8 = (anon_union_8_2_d71db6ad_for_task_group_context_11)ptVar8;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_2e30 = &local_2dd8;
  if (sVar15 != 0) {
    local_2e28.my_parent = (task_group_context *)0x0;
    ptVar5 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2e28.my_parent,0xc0);
    ptVar5->m_reserved[3] = 0;
    ptVar5->m_reserved[4] = 0;
    ptVar5->m_reserved[5] = 0;
    ptVar5->m_reserved[1] = 0;
    ptVar5->m_reserved[2] = 0;
    (ptVar5->super_task_traits).m_version_and_traits = 0;
    ptVar5->m_reserved[0] = 0;
    ptVar5->_vptr_task = (_func_int **)&PTR__task_021d9790;
    ptVar5[1]._vptr_task = (_func_int **)sVar15;
    ptVar5[1].super_task_traits.m_version_and_traits = 0;
    ptVar5[1].m_reserved[0] = 1;
    ptVar5[1].m_reserved[1] = (uint64_t)&local_2e30;
    ptVar5[1].m_reserved[2] = 0;
    ptVar5[1].m_reserved[3] = 1;
    tbb::detail::d1::auto_partition_type::auto_partition_type
              ((auto_partition_type *)(ptVar5[1].m_reserved + 5),
               (auto_partitioner *)(local_2e3a + 1));
    ptVar5[2].super_task_traits.m_version_and_traits = (uint64_t)local_2e28;
    local_2c98._0_1_ = '\0';
    local_2c98._1_1_ = '\0';
    local_2c98._2_1_ = '\0';
    local_2c98._3_1_ = '\0';
    local_2c98._4_1_ = '\0';
    local_2c98._5_1_ = '\0';
    local_2c98._6_1_ = '\0';
    local_2c98._7_1_ = '\0';
    uStack_2c90._0_4_ = 1.4013e-45;
    local_2c88 = (anon_union_8_2_d71db6ad_for_task_group_context_11)0x1;
    uStack_2c80 = (context_list *)0x1;
    ptVar5[1].m_reserved[4] = (uint64_t)&local_2c98;
    ptVar8 = &context;
    tbb::detail::r1::execute_and_wait(ptVar5,ptVar8,(wait_context *)&local_2c88,ptVar8);
  }
  cVar1 = tbb::detail::r1::is_group_execution_cancelled(&context);
  this_00 = local_2e20;
  if (cVar1 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    *(undefined1 (*) [8])
     &(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 = local_2d08
    ;
    *(task_group_context **)
     ((long)&(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 + 8)
         = uStack_2d00;
    *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)
     &(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 = local_2cf8
    ;
    *(context_list **)
     ((long)&(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 + 8)
         = pcStack_2cf0;
    *(intrusive_list_node **)
     &(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 = local_2ce8
    ;
    *(intrusive_list_node **)
     ((long)&(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 + 8)
         = piStack_2ce0;
    *(__base_type *)
     &(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 = local_2cd8
    ;
    *(void **)((long)&(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
                      field_0 + 8) = uStack_2cd0;
    *(undefined4 *)&this_00->begin = (undefined4)local_2cc8;
    *(undefined4 *)((long)&this_00->begin + 4) = local_2cc8._4_4_;
    *(undefined4 *)&this_00->end = (undefined4)uStack_2cc0;
    *(undefined4 *)((long)&this_00->end + 4) = uStack_2cc0._4_4_;
    this = pstate.prefix_state.sums;
    for (uVar14 = 0; uVar14 < taskCount; uVar14 = uVar14 + 1) {
      context.my_cpu_ctl_env =
           *(uint64_t *)
            &this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0;
      context._8_8_ =
           *(undefined8 *)
            ((long)&this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.
                    field_0 + 8);
      context.field_6 =
           *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)
            &this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0;
      context.my_context_list =
           *(context_list **)
            ((long)&this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.
                    field_0 + 8);
      context.my_node.my_prev_node =
           *(intrusive_list_node **)
            &this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0;
      context.my_node.my_next_node =
           *(intrusive_list_node **)
            ((long)&this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.
                    field_0 + 8);
      context.my_exception._M_b._M_p =
           *(__base_type *)
            &this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0;
      context.my_itt_caller =
           *(void **)((long)&this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.
                             upper.field_0 + 8);
      context.my_name = this[-0x40].begin;
      context.padding._0_8_ = this[-0x40].end;
      PrimInfoT<embree::BBox<embree::Vec3fa>_>::operator=(this,this_00);
      createPrimRefArrayMBlur::anon_class_1_0_00000001::operator()
                ((PrimInfo *)&local_2dd8.field_1,(anon_class_1_0_00000001 *)this_00,
                 (PrimInfo *)&context,(PrimInfo *)ptVar8);
      *(undefined8 *)
       &(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
           local_2dd8._0_8_;
      *(undefined8 *)
       ((long)&(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 + 8
       ) = local_2dd8._8_8_;
      *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)
       &(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
           local_2dc8;
      *(context_list **)
       ((long)&(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 + 8
       ) = uStack_2dc0;
      *(intrusive_list_node **)
       &(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
           local_2db8;
      *(intrusive_list_node **)
       ((long)&(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 + 8
       ) = uStack_2db0;
      *(ulong *)&(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
           CONCAT44(fStack_2da4,local_2da8);
      *(ulong *)((long)&(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
                        field_0 + 8) = CONCAT44(fStack_2d9c,fStack_2da0);
      *(undefined4 *)&this_00->begin = local_2d98;
      *(undefined4 *)((long)&this_00->begin + 4) = uStack_2d94;
      *(undefined4 *)&this_00->end = uStack_2d90;
      *(undefined4 *)((long)&this_00->end + 4) = uStack_2d8c;
      this = this + 1;
    }
    if ((void *)(this_00->end - this_00->begin) != local_2e00) {
      (***(_func_int ***)local_2e08._M_b._M_p)(local_2e08._M_b._M_p,0);
      sVar11 = pstate.super_ParallelForForState.taskCount;
      local_2dc8 = (task_group_context *)&local_2c98;
      local_2c98 = (ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_>
                    *)0x7f8000007f800000;
      uStack_2c90 = (task_group_context *)0x7f8000007f800000;
      local_2c88.my_parent = (task_group_context *)0xff800000ff800000;
      uStack_2c80 = (context_list *)0xff800000ff800000;
      local_2c78 = (intrusive_list_node *)0x7f8000007f800000;
      uStack_2c70 = (intrusive_list_node *)0x7f8000007f800000;
      local_2c68 = (__pointer_type)0xff800000ff800000;
      uStack_2c60 = (void *)0xff800000ff800000;
      local_2c58 = ALGORITHM;
      sStack_2c50 = 0;
      local_2df8.my_prev_node = (intrusive_list_node *)local_2e18;
      local_2df8.my_next_node = (intrusive_list_node *)&itime;
      local_2e10 = &iter;
      local_2de8.my_prev_node = &local_2df8;
      taskCount = pstate.super_ParallelForForState.taskCount;
      local_2dd8._0_8_ = &pstate;
      ptVar8 = (task_group_context *)&taskCount;
      uStack_2dc0 = (context_list *)&local_2e10;
      local_2db8 = (intrusive_list_node *)local_2e3a;
      uStack_2db0 = &local_2de8;
      local_2de8.my_next_node = (intrusive_list_node *)local_2e10;
      local_2dd8._8_8_ = ptVar8;
      tbb::detail::d1::task_group_context::task_group_context
                (&context,(context_traits)0x4,CUSTOM_CTX);
      local_2e30 = &local_2dd8;
      if (sVar11 != 0) {
        local_2e28.my_parent = (task_group_context *)0x0;
        ptVar5 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2e28.my_parent,0xc0)
        ;
        ptVar5->m_reserved[3] = 0;
        ptVar5->m_reserved[4] = 0;
        ptVar5->m_reserved[5] = 0;
        ptVar5->m_reserved[1] = 0;
        ptVar5->m_reserved[2] = 0;
        (ptVar5->super_task_traits).m_version_and_traits = 0;
        ptVar5->m_reserved[0] = 0;
        ptVar5->_vptr_task = (_func_int **)&PTR__task_021d97d8;
        ptVar5[1]._vptr_task = (_func_int **)sVar11;
        ptVar5[1].super_task_traits.m_version_and_traits = 0;
        ptVar5[1].m_reserved[0] = 1;
        ptVar5[1].m_reserved[1] = (uint64_t)&local_2e30;
        ptVar5[1].m_reserved[2] = 0;
        ptVar5[1].m_reserved[3] = 1;
        tbb::detail::d1::auto_partition_type::auto_partition_type
                  ((auto_partition_type *)(ptVar5[1].m_reserved + 5),
                   (auto_partitioner *)(local_2e3a + 1));
        ptVar5[2].super_task_traits.m_version_and_traits = (uint64_t)local_2e28;
        local_2d08 = (undefined1  [8])0x0;
        uStack_2d00._0_4_ = (__atomic_base<unsigned_int>)0x1;
        local_2cf8 = (anon_union_8_2_d71db6ad_for_task_group_context_11)0x1;
        pcStack_2cf0 = (context_list *)0x1;
        ptVar5[1].m_reserved[4] = (uint64_t)local_2d08;
        ptVar8 = &context;
        tbb::detail::r1::execute_and_wait(ptVar5,ptVar8,(wait_context *)&local_2cf8,ptVar8);
      }
      cVar1 = tbb::detail::r1::is_group_execution_cancelled(&context);
      if (cVar1 != '\0') {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"task cancelled");
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context(&context);
      local_2d08 = (undefined1  [8])local_2c98;
      uStack_2d00 = uStack_2c90;
      local_2cf8 = local_2c88;
      pcStack_2cf0 = uStack_2c80;
      local_2ce8 = local_2c78;
      piStack_2ce0 = uStack_2c70;
      local_2cd8 = (__base_type)(__base_type)local_2c68;
      uStack_2cd0 = uStack_2c60;
      local_2cc8 = local_2c58;
      uStack_2cc0 = sStack_2c50;
      psVar16 = &pstate.prefix_state.sums[0].begin;
      fVar17 = (float)local_2c68;
      fVar18 = local_2c68._4_4_;
      fVar19 = (float)uStack_2c60;
      fVar20 = uStack_2c60._4_4_;
      fVar21 = (float)local_2c78;
      fVar22 = local_2c78._4_4_;
      fVar23 = (float)uStack_2c70;
      fVar24 = uStack_2c70._4_4_;
      uVar25 = local_2c88._0_4_;
      uVar26 = local_2c88._4_4_;
      fVar27 = (float)uStack_2c80;
      fVar28 = uStack_2c80._4_4_;
      uVar29 = (float)local_2c98;
      uVar30 = local_2c98._4_4_;
      uVar31 = (float)uStack_2c90;
      uVar32 = uStack_2c90._4_4_;
      for (uVar14 = 0; uVar14 < taskCount; uVar14 = uVar14 + 1) {
        context.my_cpu_ctl_env = psVar16[-0x288];
        context._8_8_ = psVar16[-0x287];
        context.field_6 = *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)(psVar16 + -0x286);
        context.my_context_list = (context_list *)psVar16[-0x285];
        context.my_node.my_prev_node = (intrusive_list_node *)psVar16[-0x284];
        context.my_node.my_next_node = (intrusive_list_node *)psVar16[-0x283];
        context.my_exception._M_b._M_p = (__base_type)psVar16[-0x282];
        context.my_itt_caller = (void *)psVar16[-0x281];
        context.my_name = psVar16[-0x280];
        context.padding._0_8_ = psVar16[-0x27f];
        (((PrimInfoT<embree::BBox<embree::Vec3fa>_> *)(psVar16 + -8))->
        super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.m128[0] =
             (float)uVar29;
        *(undefined4 *)((long)psVar16 + -0x3c) = uVar30;
        *(undefined4 *)(psVar16 + -7) = uVar31;
        *(undefined4 *)((long)psVar16 + -0x34) = uVar32;
        (((Vec3fa *)(psVar16 + -6))->field_0).m128[0] = (float)uVar25;
        *(undefined4 *)((long)psVar16 + -0x2c) = uVar26;
        *(float *)(psVar16 + -5) = fVar27;
        *(float *)((long)psVar16 + -0x24) = fVar28;
        (((BBox3fa *)(psVar16 + -4))->lower).field_0.m128[0] = fVar21;
        *(float *)((long)psVar16 + -0x1c) = fVar22;
        *(float *)(psVar16 + -3) = fVar23;
        *(float *)((long)psVar16 + -0x14) = fVar24;
        (((Vec3fa *)(psVar16 + -2))->field_0).m128[0] = fVar17;
        *(float *)((long)psVar16 + -0xc) = fVar18;
        *(float *)(psVar16 + -1) = fVar19;
        *(float *)((long)psVar16 + -4) = fVar20;
        *psVar16 = local_2cc8;
        psVar16[1] = uStack_2cc0;
        createPrimRefArrayMBlur::anon_class_1_0_00000001::operator()
                  ((PrimInfo *)&local_2dd8.field_1,(anon_class_1_0_00000001 *)local_2d08,
                   (PrimInfo *)&context,(PrimInfo *)ptVar8);
        local_2d08 = (undefined1  [8])local_2dd8._0_8_;
        uStack_2d00 = (task_group_context *)local_2dd8._8_8_;
        local_2cf8 = local_2dc8;
        pcStack_2cf0 = uStack_2dc0;
        local_2ce8 = local_2db8;
        piStack_2ce0 = uStack_2db0;
        local_2cd8._4_4_ = fStack_2da4;
        local_2cd8._0_4_ = local_2da8;
        uStack_2cd0 = (void *)CONCAT44(fStack_2d9c,fStack_2da0);
        local_2cc8 = CONCAT44(uStack_2d94,local_2d98);
        uStack_2cc0 = CONCAT44(uStack_2d8c,uStack_2d90);
        psVar16 = psVar16 + 10;
        fVar17 = local_2da8;
        fVar18 = fStack_2da4;
        fVar19 = fStack_2da0;
        fVar20 = fStack_2d9c;
        fVar21 = (float)local_2db8;
        fVar22 = local_2db8._4_4_;
        fVar23 = (float)uStack_2db0;
        fVar24 = uStack_2db0._4_4_;
        uVar25 = (float)local_2dc8;
        uVar26 = local_2dc8._4_4_;
        fVar27 = (float)uStack_2dc0;
        fVar28 = uStack_2dc0._4_4_;
        uVar29 = local_2dd8.m128[0];
        uVar30 = local_2dd8.m128[1];
        uVar31 = local_2dd8.m128[2];
        uVar32 = local_2dd8.m128[3];
      }
      (local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.m128[0] =
           (float)uVar29;
      (local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.m128[1] =
           (float)uVar30;
      (local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.m128[2] =
           (float)uVar31;
      (local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.m128[3] =
           (float)uVar32;
      (local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.m128[0] =
           (float)uVar25;
      (local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.m128[1] =
           (float)uVar26;
      (local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.m128[2] =
           fVar27;
      (local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.m128[3] =
           fVar28;
      (local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.m128[0] =
           fVar21;
      (local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.m128[1] =
           fVar22;
      (local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.m128[2] =
           fVar23;
      (local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.m128[3] =
           fVar24;
      (local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.m128[0] =
           fVar17;
      (local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.m128[1] =
           fVar18;
      (local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.m128[2] =
           fVar19;
      (local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.m128[3] =
           fVar20;
      this_00->begin = local_2cc8;
      this_00->end = uStack_2cc0;
      this_00 = local_2e20;
    }
    return this_00;
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar6,"task cancelled");
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PrimInfo createPrimRefArrayMBlur(Scene* scene, Geometry::GTypeMask types, const size_t numPrimRefs, mvector<PrimRef>& prims, BuildProgressMonitor& progressMonitor, size_t itime)
    {
      ParallelForForPrefixSumState<PrimInfo> pstate;
      Scene::Iterator2 iter(scene,types,true);
      
      /* first try */
      progressMonitor(0);
      pstate.init(iter,size_t(1024));
      PrimInfo pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfo(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID) -> PrimInfo {
          return mesh->createPrimRefArrayMB(prims,itime,r,k,(unsigned)geomID);
        }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      
      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
      {
        progressMonitor(0);
        pinfo = parallel_for_for_prefix_sum1( pstate, iter, PrimInfo(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfo& base) -> PrimInfo {
            return mesh->createPrimRefArrayMB(prims,itime,r,base.size(),(unsigned)geomID);
          }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      }
      return pinfo;
    }